

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int formparse(OperationConfig *config,char *input,tool_mime **mimeroot,tool_mime **mimecurrent,
             _Bool literal_value)

{
  int iVar1;
  tool_mime *ptVar2;
  char *pcVar3;
  tool_mime *local_90;
  tool_mime *subparts;
  int local_80;
  int sep;
  int err;
  CURLcode res;
  tool_mime *part;
  curl_slist *headers;
  char *encoder;
  char *filename;
  char *type;
  char *data;
  char *contp;
  char *contents;
  char *name;
  tool_mime **pptStack_28;
  _Bool literal_value_local;
  tool_mime **mimecurrent_local;
  tool_mime **mimeroot_local;
  char *input_local;
  OperationConfig *config_local;
  
  contents = (char *)0x0;
  contp = (char *)0x0;
  filename = (char *)0x0;
  encoder = (char *)0x0;
  headers = (curl_slist *)0x0;
  part = (tool_mime *)0x0;
  _err = (tool_mime *)0x0;
  local_80 = 1;
  name._7_1_ = literal_value;
  pptStack_28 = mimecurrent;
  mimecurrent_local = mimeroot;
  mimeroot_local = (tool_mime **)input;
  input_local = (char *)config;
  if (*mimecurrent == (tool_mime *)0x0) {
    ptVar2 = tool_mime_new_parts((tool_mime *)0x0);
    *mimecurrent_local = ptVar2;
    if (*mimecurrent_local == (tool_mime *)0x0) goto LAB_0010fef9;
    *pptStack_28 = *mimecurrent_local;
  }
  contp = strdup((char *)mimeroot_local);
  if (contp != (char *)0x0) {
    data = strchr(contp,0x3d);
    if (data == (char *)0x0) {
      warnf(*(GlobalConfig **)(input_local + 0x3a8),"Illegally formatted input field");
    }
    else {
      subparts._4_4_ = 0;
      if (contp < data) {
        contents = contp;
      }
      pcVar3 = data + 1;
      *data = '\0';
      data = pcVar3;
      if ((*pcVar3 == '(') && ((name._7_1_ & 1) == 0)) {
        iVar1 = get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,
                               (char **)0x0,(char **)0x0,(curl_slist **)&part);
        if ((iVar1 < 0) || (_err = tool_mime_new_parts(*pptStack_28), _err == (tool_mime *)0x0))
        goto LAB_0010fef9;
        *pptStack_28 = _err;
        _err->headers = (curl_slist *)part;
        part = (tool_mime *)0x0;
        if (filename != (char *)0x0) {
          pcVar3 = strdup(filename);
          _err->type = pcVar3;
          if (_err->type == (char *)0x0) goto LAB_0010fef9;
        }
      }
      else if ((contents == (char *)0x0) &&
              ((iVar1 = strcmp(pcVar3,")"), iVar1 == 0 && ((name._7_1_ & 1) == 0)))) {
        if (*pptStack_28 == *mimecurrent_local) {
          warnf(*(GlobalConfig **)(input_local + 0x3a8),"no multipart to terminate");
          goto LAB_0010fef9;
        }
        *pptStack_28 = (*pptStack_28)->parent;
      }
      else if ((*data == '@') && ((name._7_1_ & 1) == 0)) {
        local_90 = (tool_mime *)0x0;
        do {
          data = data + 1;
          iVar1 = get_param_part((OperationConfig *)input_local,',',&data,&type,&filename,&encoder,
                                 (char **)&headers,(curl_slist **)&part);
          if (iVar1 < 0) goto LAB_0010fef9;
          if (local_90 == (tool_mime *)0x0) {
            if (iVar1 == 0x2c) {
              local_90 = tool_mime_new_parts(*pptStack_28);
              if (local_90 == (tool_mime *)0x0) goto LAB_0010fef9;
            }
            else {
              local_90 = *pptStack_28;
            }
          }
          _err = tool_mime_new_filedata(local_90,type,true,(CURLcode *)&sep);
          if (_err == (tool_mime *)0x0) goto LAB_0010fef9;
          _err->headers = (curl_slist *)part;
          part = (tool_mime *)0x0;
          _err->config = *(GlobalConfig **)(input_local + 0x3a8);
          if (sep == 0x1a) {
            if (0 < _err->size) {
              warnf(*(GlobalConfig **)(input_local + 0x3a8),"error while reading standard input");
              goto LAB_0010fef9;
            }
            free(_err->data);
            _err->data = (char *)0x0;
            _err->size = -1;
            sep = 0;
          }
          if (encoder != (char *)0x0) {
            pcVar3 = strdup(encoder);
            _err->filename = pcVar3;
            if (_err->filename == (char *)0x0) goto LAB_0010fef9;
          }
          if (filename != (char *)0x0) {
            pcVar3 = strdup(filename);
            _err->type = pcVar3;
            if (_err->type == (char *)0x0) goto LAB_0010fef9;
          }
          if (headers != (curl_slist *)0x0) {
            pcVar3 = strdup((char *)headers);
            _err->encoder = pcVar3;
            if (_err->encoder == (char *)0x0) goto LAB_0010fef9;
          }
        } while (iVar1 != 0);
        _err = (*pptStack_28)->subparts;
      }
      else {
        if ((*data == '<') && ((name._7_1_ & 1) == 0)) {
          data = data + 1;
          subparts._4_4_ =
               get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,(char **)0x0
                              ,(char **)&headers,(curl_slist **)&part);
          if ((subparts._4_4_ < 0) ||
             (_err = tool_mime_new_filedata(*pptStack_28,type,false,(CURLcode *)&sep),
             _err == (tool_mime *)0x0)) goto LAB_0010fef9;
          _err->headers = (curl_slist *)part;
          part = (tool_mime *)0x0;
          _err->config = *(GlobalConfig **)(input_local + 0x3a8);
          if (sep == 0x1a) {
            if (0 < _err->size) {
              warnf(*(GlobalConfig **)(input_local + 0x3a8),"error while reading standard input");
              goto LAB_0010fef9;
            }
            free(_err->data);
            _err->data = (char *)0x0;
            _err->size = -1;
            sep = 0;
          }
        }
        else {
          if ((name._7_1_ & 1) == 0) {
            subparts._4_4_ =
                 get_param_part((OperationConfig *)input_local,'\0',&data,&type,&filename,&encoder,
                                (char **)&headers,(curl_slist **)&part);
            if (subparts._4_4_ < 0) goto LAB_0010fef9;
          }
          else {
            type = data;
          }
          _err = tool_mime_new_data(*pptStack_28,type);
          if (_err == (tool_mime *)0x0) goto LAB_0010fef9;
          _err->headers = (curl_slist *)part;
          part = (tool_mime *)0x0;
        }
        if (encoder != (char *)0x0) {
          pcVar3 = strdup(encoder);
          _err->filename = pcVar3;
          if (_err->filename == (char *)0x0) goto LAB_0010fef9;
        }
        if (filename != (char *)0x0) {
          pcVar3 = strdup(filename);
          _err->type = pcVar3;
          if (_err->type == (char *)0x0) goto LAB_0010fef9;
        }
        if (headers != (curl_slist *)0x0) {
          pcVar3 = strdup((char *)headers);
          _err->encoder = pcVar3;
          if (_err->encoder == (char *)0x0) goto LAB_0010fef9;
        }
        if (subparts._4_4_ != 0) {
          *data = (char)subparts._4_4_;
          warnf(*(GlobalConfig **)(input_local + 0x3a8),"garbage at end of field specification: %s",
                data);
        }
      }
      if (contents != (char *)0x0) {
        pcVar3 = strdup(contents);
        _err->name = pcVar3;
        if (_err->name == (char *)0x0) goto LAB_0010fef9;
      }
      local_80 = 0;
    }
  }
LAB_0010fef9:
  free(contp);
  contp = (char *)0x0;
  curl_slist_free_all(part);
  return local_80;
}

Assistant:

int formparse(struct OperationConfig *config,
              const char *input,
              struct tool_mime **mimeroot,
              struct tool_mime **mimecurrent,
              bool literal_value)
{
  /* input MUST be a string in the format 'name=contents' and we will
     build a linked list with the info */
  char *name = NULL;
  char *contents = NULL;
  char *contp;
  char *data;
  char *type = NULL;
  char *filename = NULL;
  char *encoder = NULL;
  struct curl_slist *headers = NULL;
  struct tool_mime *part = NULL;
  CURLcode res;
  int err = 1;

  /* Allocate the main mime structure if needed. */
  if(!*mimecurrent) {
    *mimeroot = tool_mime_new_parts(NULL);
    if(!*mimeroot)
      goto fail;
    *mimecurrent = *mimeroot;
  }

  /* Make a copy we can overwrite. */
  contents = strdup(input);
  if(!contents)
    goto fail;

  /* Scan for the end of the name. */
  contp = strchr(contents, '=');
  if(contp) {
    int sep = '\0';
    if(contp > contents)
      name = contents;
    *contp++ = '\0';

    if(*contp == '(' && !literal_value) {
      /* Starting a multipart. */
      sep = get_param_part(config, '\0',
                           &contp, &data, &type, NULL, NULL, &headers);
      if(sep < 0)
        goto fail;
      part = tool_mime_new_parts(*mimecurrent);
      if(!part)
        goto fail;
      *mimecurrent = part;
      part->headers = headers;
      headers = NULL;
      SET_TOOL_MIME_PTR(part, type);
    }
    else if(!name && !strcmp(contp, ")") && !literal_value) {
      /* Ending a multipart. */
      if(*mimecurrent == *mimeroot) {
        warnf(config->global, "no multipart to terminate");
        goto fail;
      }
      *mimecurrent = (*mimecurrent)->parent;
    }
    else if('@' == contp[0] && !literal_value) {

      /* we use the @-letter to indicate filename(s) */

      struct tool_mime *subparts = NULL;

      do {
        /* since this was a file, it may have a content-type specifier
           at the end too, or a filename. Or both. */
        ++contp;
        sep = get_param_part(config, ',', &contp,
                             &data, &type, &filename, &encoder, &headers);
        if(sep < 0) {
          goto fail;
        }

        /* now contp point to comma or string end.
           If more files to come, make sure we have multiparts. */
        if(!subparts) {
          if(sep != ',')    /* If there is a single file. */
            subparts = *mimecurrent;
          else {
            subparts = tool_mime_new_parts(*mimecurrent);
            if(!subparts)
              goto fail;
          }
        }

        /* Store that file in a part. */
        part = tool_mime_new_filedata(subparts, data, TRUE, &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
        SET_TOOL_MIME_PTR(part, filename);
        SET_TOOL_MIME_PTR(part, type);
        SET_TOOL_MIME_PTR(part, encoder);

        /* *contp could be '\0', so we just check with the delimiter */
      } while(sep); /* loop if there is another filename */
      part = (*mimecurrent)->subparts;  /* Set name on group. */
    }
    else {
      if(*contp == '<' && !literal_value) {
        ++contp;
        sep = get_param_part(config, '\0', &contp,
                             &data, &type, NULL, &encoder, &headers);
        if(sep < 0)
          goto fail;

        part = tool_mime_new_filedata(*mimecurrent, data, FALSE,
                                      &res);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
        part->config = config->global;
        if(res == CURLE_READ_ERROR) {
            /* An error occurred while reading stdin: if read has started,
               issue the error now. Else, delay it until processed by
               libcurl. */
          if(part->size > 0) {
            warnf(config->global,
                  "error while reading standard input");
            goto fail;
          }
          curlx_safefree(part->data);
          part->size = -1;
          res = CURLE_OK;
        }
      }
      else {
        if(literal_value)
          data = contp;
        else {
          sep = get_param_part(config, '\0', &contp,
                               &data, &type, &filename, &encoder, &headers);
          if(sep < 0)
            goto fail;
        }

        part = tool_mime_new_data(*mimecurrent, data);
        if(!part)
          goto fail;
        part->headers = headers;
        headers = NULL;
      }

      SET_TOOL_MIME_PTR(part, filename);
      SET_TOOL_MIME_PTR(part, type);
      SET_TOOL_MIME_PTR(part, encoder);

      if(sep) {
        *contp = (char) sep;
        warnf(config->global,
              "garbage at end of field specification: %s", contp);
      }
    }

    /* Set part name. */
    SET_TOOL_MIME_PTR(part, name);
  }
  else {
    warnf(config->global, "Illegally formatted input field");
    goto fail;
  }
  err = 0;
fail:
  curlx_safefree(contents);
  curl_slist_free_all(headers);
  return err;
}